

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float size;
  undefined2 uVar1;
  ImFont *this;
  char *pcVar2;
  ImWchar c;
  ImU32 col;
  ImFontGlyph *pIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  ImVec2 IVar8;
  float fVar9;
  char *text_end_ellipsis;
  float local_a0;
  float local_9c;
  ImVec2 local_98;
  undefined1 local_88 [16];
  float local_74;
  char *local_70;
  ImVec2 local_68;
  ulong local_60;
  ImGuiContext *local_58;
  ImVec2 local_50;
  float local_48;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  local_88._8_8_ = local_88._0_8_;
  local_88._0_8_ = pos_max;
  local_a0 = clip_max_x;
  local_48 = ellipsis_max_x;
  if (text_end_full == (char *)0x0) {
    text_end_full = FindRenderedTextEnd(text,(char *)0x0);
    pos_max = (ImVec2 *)local_88._0_8_;
  }
  if (text_size_if_known == (ImVec2 *)0x0) {
    local_68 = CalcTextSize(text,text_end_full,false,0.0);
    pos_max = (ImVec2 *)local_88._0_8_;
  }
  else {
    local_68 = *text_size_if_known;
  }
  if (local_68.x <= pos_max->x - pos_min->x) {
    text_end_ellipsis = (char *)CONCAT44(pos_max->y,local_a0);
    local_50.x = 0.0;
    local_50.y = 0.0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&text_end_ellipsis,text,text_end_full,&local_68,
                        &local_50,(ImRect *)0x0);
  }
  else {
    local_58 = pIVar4;
    this = draw_list->_Data->Font;
    size = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    uVar1 = this->EllipsisChar;
    c = 0x2e;
    if (uVar1 != 0xffff) {
      c = uVar1;
    }
    local_70 = text_end_full;
    pIVar3 = ImFont::FindGlyph(this,c);
    pcVar2 = local_70;
    local_74 = pIVar3->X1;
    local_60 = (ulong)(uVar1 == 0xffff);
    local_9c = local_74;
    if (uVar1 == 0xffff) {
      fVar9 = draw_list->_Data->FontSize / this->FontSize;
      local_9c = (local_74 - pIVar3->X0) + fVar9;
      local_74 = local_9c * 3.0 - fVar9;
    }
    uVar7 = -(uint)(local_48 <= *(float *)local_88._0_8_);
    fVar9 = ((float)(~uVar7 & (uint)local_48 | (uint)*(float *)local_88._0_8_ & uVar7) - local_74) -
            pos_min->x;
    if (fVar9 <= 1.0) {
      fVar9 = 1.0;
    }
    local_98 = ImFont::CalcTextSizeA(this,size,fVar9,0.0,text,local_70,&text_end_ellipsis);
    if (text_end_ellipsis < pcVar2 && text_end_ellipsis == text) {
      uVar7 = ImTextCountUtf8BytesFromChar(text,pcVar2);
      text_end_ellipsis = text + uVar7;
      local_98 = ImFont::CalcTextSizeA
                           (this,size,3.4028235e+38,0.0,text,text_end_ellipsis,(char **)0x0);
    }
    iVar5 = (int)local_60 * 2 + 1;
    while ((pcVar2 = text_end_ellipsis, text < text_end_ellipsis &&
           ((text_end_ellipsis[-1] == ' ' || (text_end_ellipsis[-1] == '\t'))))) {
      text_end_ellipsis = text_end_ellipsis + -1;
      IVar8 = ImFont::CalcTextSizeA
                        (this,size,3.4028235e+38,0.0,text_end_ellipsis,pcVar2,(char **)0x0);
      local_98.x = local_98.x - IVar8.x;
    }
    local_50.y = *(float *)(local_88._0_8_ + 4);
    local_50.x = local_a0;
    local_38.x = 0.0;
    local_38.y = 0.0;
    RenderTextClippedEx(draw_list,pos_min,&local_50,text,text_end_ellipsis,&local_68,&local_38,
                        (ImRect *)0x0);
    local_98.x = local_98.x + pos_min->x;
    pIVar4 = local_58;
    text_end_full = local_70;
    if (local_74 + local_98.x <= local_48) {
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, pIVar4 = local_58, text_end_full = local_70,
            bVar6) {
        local_88 = ZEXT416((uint)pos_min->y);
        col = GetColorU32(0,1.0);
        IVar8.y = (float)local_88._0_4_;
        IVar8.x = local_98.x;
        ImFont::RenderChar(this,draw_list,size,IVar8,col,c);
        local_98.x = local_98.x + local_9c;
      }
    }
  }
  if (pIVar4->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = (ImWchar)'.';
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}